

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2BufferSharingTest::renderResource
          (GLES2BufferSharingTest *this,Surface *screen,Surface *reference)

{
  unsigned_short uVar1;
  byte bVar2;
  glReadPixelsFunc p_Var3;
  pointer puVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  Surface *pSVar7;
  int iVar8;
  GLenum GVar9;
  GLuint GVar10;
  GLuint GVar11;
  TestError *pTVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  void *pvVar17;
  int iVar18;
  unsigned_short uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float xf;
  float fVar29;
  float fVar32;
  undefined1 auVar31 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  vector<float,_std::allocator<float>_> coords;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  ProgramSources sources;
  ShaderProgram program;
  value_type local_278;
  value_type local_258;
  float local_238;
  GLsizei GStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined1 local_228 [16];
  undefined8 local_218;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  IVec4 local_1f8;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  ProgramSources local_1d0;
  ShaderProgram local_100;
  undefined1 auVar30 [16];
  
  local_278._M_string_length = (size_type)local_278._M_dataplus._M_p;
  local_258._M_string_length = (size_type)local_258._M_dataplus._M_p;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_218 = screen;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,
             "attribute mediump vec2 a_pos;\nattribute mediump float a_color;\nvarying mediump float v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
             ,"");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,
             "varying mediump float v_color;\nvoid main(void)\n{\n\tgl_FragColor = vec4(v_color, v_color, v_color, 1.0);\n}\n"
             ,"");
  memset(&local_1d0,0,0xac);
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._0_9_ = SUB169((undefined1  [16])0x0,0);
  local_1d0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_1d0._192_9_ = SUB169((undefined1  [16])0x0,7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d0.sources,&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_1d0.sources + 1,&local_278);
  glu::ShaderProgram::ShaderProgram(&local_100,&(this->super_GLES2SharingTest).m_gl,&local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1d0.attribLocationBindings);
  lVar20 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_1d0.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar20));
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x168);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_258._M_dataplus._M_p = (pointer)0x0;
  local_258._M_string_length = 0;
  uVar21 = 0;
  local_258.field_2._M_allocated_capacity = 0;
  local_278.field_2._M_allocated_capacity = 0;
  local_278._M_dataplus._M_p = (pointer)0x0;
  local_278._M_string_length = 0;
  if (3 < *(int *)&(this->m_buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&(this->m_buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) {
    uVar19 = 0;
    do {
      if (local_258._M_string_length == local_258.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar19;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_258,
                   (iterator)local_258._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_258._M_string_length = uVar19;
        local_258._M_string_length = local_258._M_string_length + 2;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar19 + 1;
      if (local_258._M_string_length == local_258.field_2._M_allocated_capacity) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_258,
                   (iterator)local_258._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_258._M_string_length =
             (unsigned_short)
             local_1d0.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_258._M_string_length = local_258._M_string_length + 2;
      }
      uVar1 = uVar19 + 2;
      if (local_258._M_string_length == local_258.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar1;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_258,
                   (iterator)local_258._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_258._M_string_length = uVar1;
        local_258._M_string_length = local_258._M_string_length + 2;
      }
      if (local_258._M_string_length == local_258.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar1;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_258,
                   (iterator)local_258._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_258._M_string_length = uVar1;
        local_258._M_string_length = local_258._M_string_length + 2;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_2_ = uVar19 + 3;
      if (local_258._M_string_length == local_258.field_2._M_allocated_capacity) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_258,
                   (iterator)local_258._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_258._M_string_length =
             (unsigned_short)
             local_1d0.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_258._M_string_length = local_258._M_string_length + 2;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (float)CONCAT22(local_1d0.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._2_2_,uVar19);
      if (local_258._M_string_length == local_258.field_2._M_allocated_capacity) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_258,
                   (iterator)local_258._M_string_length,(unsigned_short *)&local_1d0);
      }
      else {
        *(unsigned_short *)local_258._M_string_length = uVar19;
        local_258._M_string_length = local_258._M_string_length + 2;
      }
      local_238 = (float)(uVar21 & 0xf) * 0.125 + -1.0;
      if (local_278._M_string_length == local_278.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_238;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_278,
                   (iterator)local_278._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_278._M_string_length = local_238;
        local_278._M_string_length = local_278._M_string_length + 4;
      }
      local_228 = ZEXT416((uint)((float)(int)uVar21 * 0.0625));
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (float)(int)((float)(int)uVar21 * 0.0625) * 0.125 + -1.0;
      local_208 = ZEXT416((uint)local_1d0.sources[0].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (local_278._M_string_length == local_278.field_2._M_allocated_capacity) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_278,
                   (iterator)local_278._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_278._M_string_length =
             local_1d0.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_4_;
        local_278._M_string_length = local_278._M_string_length + 4;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_238;
      if (local_278._M_string_length == local_278.field_2._M_allocated_capacity) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_278,
                   (iterator)local_278._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_278._M_string_length = local_238;
        local_278._M_string_length = local_278._M_string_length + 4;
      }
      local_238 = (float)((int)(float)local_228._0_4_ + 1) * 0.125 + -1.0;
      if (local_278._M_string_length == local_278.field_2._M_allocated_capacity) {
        local_1d0.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_238;
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_278,
                   (iterator)local_278._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_278._M_string_length = local_238;
        local_278._M_string_length = local_278._M_string_length + 4;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (float)((uVar21 & 0xf) + 1) * 0.125 + -1.0;
      local_228._0_4_ =
           local_1d0.sources[0].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_4_;
      if (local_278._M_string_length == local_278.field_2._M_allocated_capacity) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_278,
                   (iterator)local_278._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_278._M_string_length =
             local_1d0.sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_4_;
        local_278._M_string_length = local_278._M_string_length + 4;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_238;
      if (local_278._M_string_length == local_278.field_2._M_allocated_capacity) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_278,
                   (iterator)local_278._M_string_length,(float *)&local_1d0);
      }
      else {
        *(float *)local_278._M_string_length = local_238;
        local_278._M_string_length = local_278._M_string_length + 4;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (float)local_228._0_4_;
      if (local_278._M_string_length == local_278.field_2._M_allocated_capacity) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_278,
                   (iterator)local_278._M_string_length,(float *)&local_1d0);
      }
      else {
        *(undefined4 *)local_278._M_string_length = local_228._0_4_;
        local_278._M_string_length = local_278._M_string_length + 4;
      }
      local_1d0.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (float)local_208._0_4_;
      if (local_278._M_string_length == local_278.field_2._M_allocated_capacity) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  ((vector<float,_std::allocator<float>_> *)&local_278,
                   (iterator)local_278._M_string_length,(float *)&local_1d0);
      }
      else {
        *(undefined4 *)local_278._M_string_length = local_208._0_4_;
        local_278._M_string_length = local_278._M_string_length + 4;
      }
      uVar21 = uVar21 + 1;
      iVar8 = *(int *)&(this->m_buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
              *(int *)&(this->m_buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      iVar13 = iVar8 + 3;
      if (-1 < iVar8) {
        iVar13 = iVar8;
      }
      uVar19 = uVar19 + 4;
    } while ((int)uVar21 < iVar13 >> 2);
  }
  pSVar7 = local_218;
  if (local_218 == (Surface *)0x0) {
    local_238 = 3.36312e-43;
    GStack_234 = 0xf0;
  }
  else {
    local_238 = (float)local_218->m_width;
    GStack_234 = local_218->m_height;
  }
  uStack_230 = 0;
  uStack_22c = 0;
  (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,(GLsizei)local_238,GStack_234);
  GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar9,"viewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x18e);
  (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
  GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar9,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,400);
  (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
  GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar9,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x191);
  (*(this->super_GLES2SharingTest).m_gl.useProgram)(local_100.m_program.m_program);
  GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar9,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x193);
  GVar10 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                     (local_100.m_program.m_program,"a_pos");
  GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar9,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x196);
  if (GVar10 != 0xffffffff) {
    GVar11 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                       (local_100.m_program.m_program,"a_color");
    GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar9,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x19a);
    if (GVar11 != 0xffffffff) {
      (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar11);
      GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"enableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x19d);
      (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar10);
      GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"enableVertexAttribArray(gridLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x19e);
      (*(this->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,this->m_glBuffer);
      GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"bindBuffer(GL_ARRAY_BUFFER, m_glBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a0);
      (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar11,1,0x1401,'\x01',0,(void *)0x0);
      GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,
                      "vertexAttribPointer(colorLocation, 1, GL_UNSIGNED_BYTE, GL_TRUE, 0, DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a1);
      (*(this->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,0);
      GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a2);
      (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar10,2,0x1406,'\0',0,local_278._M_dataplus._M_p);
      GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,
                      "vertexAttribPointer(gridLocation, 2, GL_FLOAT, GL_FALSE, 0, &(coords[0]))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a4);
      (*(this->super_GLES2SharingTest).m_gl.drawElements)
                (4,(GLsizei)(local_258._M_string_length - (long)local_258._M_dataplus._M_p >> 1),
                 0x1403,local_258._M_dataplus._M_p);
      GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,
                      "drawElements(GL_TRIANGLES, (GLsizei)indices.size(), GL_UNSIGNED_SHORT, &(indices[0]))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a6);
      (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar11);
      GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"disableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a7);
      (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar10);
      GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"disableVertexAttribArray(gridLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1a8);
      (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
      GVar9 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar9,"useProgram(0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x1aa);
      if (pSVar7 != (Surface *)0x0) {
        local_1f8.m_data[0] = RGBA;
        local_1f8.m_data[1] = UNORM_INT8;
        pvVar17 = (void *)(reference->m_pixels).m_cap;
        if (pvVar17 != (void *)0x0) {
          pvVar17 = (reference->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&local_1d0,(TextureFormat *)&local_1f8,reference->m_width,
                   reference->m_height,1,pvVar17);
        local_1f8.m_data[0] = 0xff;
        local_1f8.m_data[1] = SNORM_INT8;
        local_1f8.m_data[2] = 0;
        local_1f8.m_data[3] = 0xff;
        tcu::clear((PixelBufferAccess *)&local_1d0,&local_1f8);
        p_Var3 = (this->super_GLES2SharingTest).m_gl.readPixels;
        iVar13 = local_218->m_width;
        iVar8 = local_218->m_height;
        local_1f8.m_data[0] = RGBA;
        local_1f8.m_data[1] = UNORM_INT8;
        pvVar17 = (void *)(local_218->m_pixels).m_cap;
        if (pvVar17 != (void *)0x0) {
          pvVar17 = (local_218->m_pixels).m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&local_1d0,(TextureFormat *)&local_1f8,iVar13,iVar8,1,
                   pvVar17);
        (*p_Var3)(0,0,iVar13,iVar8,0x1908,0x1401,
                  local_1d0.sources[1].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
        puVar4 = (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar8 = *(int *)&(this->m_buffer).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (int)puVar4;
        iVar13 = iVar8 + 3;
        if (-1 < iVar8) {
          iVar13 = iVar8;
        }
        local_208._0_4_ = iVar13;
        if (3 < iVar8) {
          fVar26 = (float)(int)local_238;
          fStack_210 = (float)GStack_234;
          iVar23 = -(uint)(fVar26 * 0.5 < 0.0);
          iVar24 = -(uint)(fStack_210 * 0.5 < 0.0);
          auVar6._4_4_ = iVar23;
          auVar6._0_4_ = iVar23;
          auVar6._8_4_ = iVar24;
          auVar6._12_4_ = iVar24;
          uVar21 = movmskpd(iVar8,auVar6);
          fVar27 = -0.5;
          if ((uVar21 & 1) == 0) {
            fVar27 = 0.5;
          }
          fVar28 = -0.5;
          if ((uVar21 & 2) == 0) {
            fVar28 = 0.5;
          }
          local_208._0_4_ = iVar13 >> 2;
          local_1e8 = (float)(int)(fVar27 + fVar26 * 0.5);
          fVar27 = (float)(int)(fStack_210 * 0.5 + fVar28);
          local_218 = (Surface *)CONCAT44(fStack_210,fStack_210);
          uVar15 = 0;
          do {
            uVar14 = (uint)uVar15;
            iVar8 = (int)((float)(int)uVar14 * 0.0625) + 1;
            fVar33 = ((float)iVar8 * 0.125 + -1.0) * fStack_210 * 0.5 + fVar27;
            fVar34 = ((float)(int)((float)(int)uVar14 * 0.0625) * 0.125 + -1.0) * fStack_210 * 0.5 +
                     fVar27;
            iVar23 = -(uint)(fVar33 < 0.0);
            iVar24 = -(uint)(fVar34 < 0.0);
            auVar31._4_4_ = iVar24;
            auVar31._0_4_ = iVar23;
            auVar31._8_4_ = iVar24;
            auVar31._12_4_ = iVar24;
            auVar30._8_8_ = auVar31._8_8_;
            auVar30._4_4_ = iVar23;
            auVar30._0_4_ = iVar23;
            uVar21 = movmskpd(iVar8,auVar30);
            fVar28 = -0.5;
            if ((uVar21 & 2) == 0) {
              fVar28 = 0.5;
            }
            fVar35 = -0.5;
            if ((uVar21 & 1) == 0) {
              fVar35 = 0.5;
            }
            local_228._0_8_ = uVar15;
            fVar29 = ((float)(uVar14 & 0xf) * 0.125 + -1.0) * fVar26 * 0.5 + local_1e8;
            fVar32 = ((float)((uVar14 & 0xf) + 1) * 0.125 + -1.0) * fVar26 * 0.5 + local_1e8;
            uVar21 = -(uint)(fVar29 < 0.0);
            uVar25 = -(uint)(fVar32 < 0.0);
            local_238 = (float)(int)((float)(uVar21 & 0xbf000000 | ~uVar21 & 0x3f000000) + fVar29);
            iVar8 = (int)((float)(uVar25 & 0xbf000000 | ~uVar25 & 0x3f000000) + fVar32);
            if (iVar8 - (int)local_238 != 0 && (int)local_238 <= iVar8) {
              iVar24 = (int)(fVar34 + fVar28);
              iVar16 = (int)(fVar35 + fVar33);
              iVar18 = iVar16 - iVar24;
              iVar23 = (int)local_238;
              do {
                if (iVar24 < iVar16) {
                  fVar28 = ((float)(iVar23 - (int)local_238) + 0.5) /
                           (float)(iVar8 - (int)local_238);
                  pvVar17 = (reference->m_pixels).m_ptr;
                  iVar22 = 0;
                  do {
                    fVar34 = ((float)iVar22 + 0.5) / (float)iVar18;
                    bVar5 = fVar34 < fVar28;
                    fVar33 = 1.0 - fVar28;
                    if (!bVar5) {
                      fVar34 = 1.0 - fVar34;
                      fVar33 = fVar28;
                    }
                    uVar21 = (uint)bVar5 * 2 | uVar14 * 4;
                    bVar2 = puVar4[(int)(uVar21 | 1)];
                    *(uint *)((long)pvVar17 +
                             (long)((iVar24 + iVar22) * reference->m_width + iVar23) * 4) =
                         ((int)((float)(int)((uint)puVar4[(int)uVar21] - (uint)bVar2) * fVar34 +
                               (float)(int)((uint)puVar4[(int)(uVar14 * 4 + (uint)!bVar5 * 2)] -
                                           (uint)bVar2) * fVar33 + (float)bVar2) & 0xffU) * 0x10101
                         | 0xff000000;
                    iVar22 = iVar22 + 1;
                  } while (iVar18 != iVar22);
                }
                iVar23 = iVar23 + 1;
              } while (iVar23 != iVar8);
            }
            uVar15 = (ulong)(uVar14 + 1);
            fStack_20c = fStack_210;
            fStack_1e4 = local_1e8;
            fStack_1e0 = local_1e8;
            fStack_1dc = local_1e8;
          } while (uVar14 + 1 != iVar13 >> 2);
        }
      }
      if (local_278._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_278._M_dataplus._M_p,
                        local_278.field_2._M_allocated_capacity - (long)local_278._M_dataplus._M_p);
      }
      if (local_258._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_258._M_dataplus._M_p,
                        local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p);
      }
      glu::ShaderProgram::~ShaderProgram(&local_100);
      return;
    }
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,(char *)0x0,"colorLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x19b);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar12,(char *)0x0,"gridLocation != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x197);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2BufferSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump float a_color;\n"
	"varying mediump float v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump float v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = vec4(v_color, v_color, v_color, 1.0);\n"
	"}\n";

	glu::ShaderProgram program(m_gl, glu::makeVtxFragSources(vertexShader, fragmentShader));

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	std::vector<deUint16>	indices;
	std::vector<float>		coords;

	DE_ASSERT(m_buffer.size() % 4 == 0);

	for (int i = 0; i < (int)m_buffer.size() / 4; i++)
	{
		indices.push_back((deUint16)(i*4));
		indices.push_back((deUint16)(i*4 + 1));
		indices.push_back((deUint16)(i*4 + 2));
		indices.push_back((deUint16)(i*4 + 2));
		indices.push_back((deUint16)(i*4 + 3));
		indices.push_back((deUint16)(i*4));

		coords.push_back(0.125f * (float)(i % 16) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f)) - 1.0f);

		coords.push_back(0.125f * (float)(i % 16) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f);

		coords.push_back(0.125f * (float)((i % 16) + 1) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f);

		coords.push_back(0.125f * (float)((i % 16) + 1) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f)) - 1.0f);
	}

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	GLuint gridLocation = m_gl.getAttribLocation(program.getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(gridLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(program.getProgram(), "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(gridLocation));

	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_glBuffer));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 1, GL_UNSIGNED_BYTE, GL_TRUE, 0, DE_NULL));
	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, 0));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(gridLocation, 2, GL_FLOAT, GL_FALSE, 0, &(coords[0])));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, (GLsizei)indices.size(), GL_UNSIGNED_SHORT, &(indices[0])));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(gridLocation));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());
		for (int i = 0; i < (int)m_buffer.size() / 4; i++)
		{
			float fx1 = 0.125f * (float)(i % 16) - 1.0f;
			float fy1 = 0.125f * (float)((int)((float)i / 16.0f)) - 1.0f;
			float fx2 = 0.125f * (float)((i % 16) + 1) - 1.0f;
			float fy2 = 0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f;

			int ox = deRoundFloatToInt32((float)width	/ 2.0f);
			int oy = deRoundFloatToInt32((float)height	/ 2.0f);
			int x1 = deRoundFloatToInt32(((float)width	 * fx1 / 2.0f) + (float)ox);
			int y1 = deRoundFloatToInt32(((float)height	 * fy1 / 2.0f) + (float)oy);
			int x2 = deRoundFloatToInt32(((float)width	 * fx2 / 2.0f) + (float)ox);
			int y2 = deRoundFloatToInt32(((float)height	 * fy2 / 2.0f) + (float)oy);

			for (int x = x1; x < x2; x++)
			{
				for (int y = y1; y < y2; y++)
				{
					float		xf		= ((float)(x-x1) + 0.5f) / (float)(x2 - x1);
					float		yf		= ((float)(y-y1) + 0.5f) / (float)(y2 - y1);
					bool		tri		= yf >= xf;
					deUint8		a		= m_buffer[i*4 + (tri ? 1 : 3)];
					deUint8		b		= m_buffer[i*4 + (tri ? 2 : 0)];
					deUint8		c		= m_buffer[i*4 + (tri ? 0 : 2)];
					float		s		= tri ? xf : 1.0f-xf;
					float		t		= tri ? 1.0f-yf : yf;
					float		val		= (float)a + (float)(b-a)*s + (float)(c-a)*t;

					reference->setPixel(x, y, tcu::RGBA((deUint8)val, (deUint8)val, (deUint8)val, 255));
				}
			}
		}
	}
}